

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

jpc_dec_seg_t * jpc_seg_alloc(void)

{
  jpc_dec_seg_t *pjVar1;
  
  pjVar1 = (jpc_dec_seg_t *)jas_malloc(0x38);
  if (pjVar1 == (jpc_dec_seg_t *)0x0) {
    pjVar1 = (jpc_dec_seg_t *)0x0;
  }
  else {
    pjVar1->next = (jpc_dec_seg_s *)0x0;
    pjVar1->prev = (jpc_dec_seg_s *)0x0;
    pjVar1->passno = -1;
    pjVar1->numpasses = 0;
    pjVar1->maxpasses = 0;
    *(undefined8 *)&pjVar1->type = 0;
    pjVar1->stream = (jas_stream_t *)0x0;
    pjVar1->cnt = 0;
    pjVar1->complete = 0;
    pjVar1->lyrno = -1;
  }
  return pjVar1;
}

Assistant:

jpc_dec_seg_t *jpc_seg_alloc()
{
	jpc_dec_seg_t *seg;

	if (!(seg = jas_malloc(sizeof(jpc_dec_seg_t)))) {
		return 0;
	}
	seg->prev = 0;
	seg->next = 0;
	seg->passno = -1;
	seg->numpasses = 0;
	seg->maxpasses = 0;
	seg->type = JPC_SEG_INVALID;
	seg->stream = 0;
	seg->cnt = 0;
	seg->complete = 0;
	seg->lyrno = -1;
	return seg;
}